

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

PartiallySignedTransaction *
ProcessPSBT(PartiallySignedTransaction *__return_storage_ptr__,string *psbt_string,any *context,
           HidingSigningProvider *provider,int sighash_type,bool finalize)

{
  vector<PSBTInput,_std::allocator<PSBTInput>_> *this;
  long lVar1;
  bool bVar2;
  NodeContext *node;
  reference pvVar3;
  reference pvVar4;
  CTxOut *pCVar5;
  UniValue *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint i;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  CTransactionRef tx;
  uint256 block_hash;
  vector<CTxOut,_std::allocator<CTxOut>_> local_b0;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  string error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)provider;
  PartiallySignedTransaction::PartiallySignedTransaction(__return_storage_ptr__);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar2 = DecodeBase64PSBT(__return_storage_ptr__,psbt_string,&error);
  if (bVar2) {
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      BaseIndex::BlockUntilSyncedToCurrentChain
                ((BaseIndex *)
                 g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                 super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                 super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl);
    }
    node = EnsureAnyNodeContext(context);
    coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &coins._M_t._M_impl.super__Rb_tree_header._M_header;
    coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this = &__return_storage_ptr__->inputs;
    coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar7 = 0; uVar6 = (ulong)uVar7,
        uVar6 < (ulong)(((long)*(pointer *)
                                ((long)&(__return_storage_ptr__->tx).
                                        super__Optional_base<CMutableTransaction,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                        .super__Optional_payload_base<CMutableTransaction>.
                                        _M_payload._M_value.vin + 8) -
                        *(long *)&(__return_storage_ptr__->tx).
                                  super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                                  .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                  super__Optional_payload_base<CMutableTransaction>._M_payload.
                                  _M_value.vin) / 0x68); uVar7 = uVar7 + 1) {
      pvVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(this,uVar6);
      pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)__return_storage_ptr__,uVar6);
      if ((pvVar3->non_witness_utxo).
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
            g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
            super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
            super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
LAB_002f4fb0:
          CTxMemPool::get((CTxMemPool *)&block_hash,
                          (uint256 *)
                          (node->mempool)._M_t.
                          super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&block_hash);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     (block_hash.super_base_blob<256U>.m_data._M_elems + 8));
          if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) goto LAB_002f4ff9;
          std::
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::operator[](&coins,&pvVar4->prevout);
        }
        else {
          block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          TxIndex::FindTx((TxIndex *)
                          g_txindex._M_t.
                          super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                          super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                          super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl,(uint256 *)pvVar4,
                          &block_hash,&tx);
          if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) goto LAB_002f4fb0;
LAB_002f4ff9:
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pvVar3,
                     &tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    if (coins._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::node::FindCoins(node,&coins);
      for (uVar7 = 0; uVar6 = (ulong)uVar7,
          uVar6 < (ulong)(((long)*(pointer *)
                                  ((long)&(__return_storage_ptr__->tx).
                                          super__Optional_base<CMutableTransaction,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                          .super__Optional_payload_base<CMutableTransaction>.
                                          _M_payload._M_value.vin + 8) -
                          *(long *)&(__return_storage_ptr__->tx).
                                    super__Optional_base<CMutableTransaction,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                    .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                    _M_value.vin) / 0x68); uVar7 = uVar7 + 1) {
        pvVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(this,uVar6);
        if ((pvVar3->non_witness_utxo).
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                             ((vector<CTxIn,_std::allocator<CTxIn>_> *)__return_storage_ptr__,uVar6)
          ;
          pCVar5 = &std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::at(&coins,&pvVar4->prevout)->out;
          if (pCVar5->nValue != -1) {
            bVar2 = IsSegWitOutput(&provider->super_SigningProvider,&pCVar5->scriptPubKey);
            if (bVar2) {
              CTxOut::operator=(&pvVar3->witness_utxo,pCVar5);
            }
          }
        }
      }
    }
    PrecomputePSBTData((PrecomputedTransactionData *)&block_hash,__return_storage_ptr__);
    for (uVar7 = 0;
        (ulong)uVar7 <
        (ulong)(((long)*(pointer *)
                        ((long)&(__return_storage_ptr__->tx).
                                super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin + 8) -
                *(long *)&(__return_storage_ptr__->tx).
                          super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin)
               / 0x68); uVar7 = uVar7 + 1) {
      pvVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(this,(ulong)uVar7);
      bVar2 = PSBTInputSigned(pvVar3);
      if (!bVar2) {
        SignPSBTInput(&provider->super_SigningProvider,__return_storage_ptr__,uVar7,
                      (PrecomputedTransactionData *)&block_hash,sighash_type,(SignatureData *)0x0,
                      finalize);
      }
    }
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)*(pointer *)
                                ((long)&(__return_storage_ptr__->tx).
                                        super__Optional_base<CMutableTransaction,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                        .super__Optional_payload_base<CMutableTransaction>.
                                        _M_payload._M_value.vout + 8) -
                        *(long *)&(__return_storage_ptr__->tx).
                                  super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                                  .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                  super__Optional_payload_base<CMutableTransaction>._M_payload.
                                  _M_value.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)
                       / 0x28); uVar6 = (ulong)((int)uVar6 + 1)) {
      UpdatePSBTOutput(&provider->super_SigningProvider,__return_storage_ptr__,(int)uVar6);
    }
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                  ,1);
    RemoveUnnecessaryTransactions(__return_storage_ptr__,(int *)&tx);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
    ::~_Rb_tree(&coins._M_t);
    std::__cxx11::string::~string((string *)&error);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
    tinyformat::format<std::__cxx11::string>
              ((string *)&block_hash,(tinyformat *)"TX decode failed %s",(char *)&error,args);
    JSONRPCError(__return_storage_ptr___00,-0x16,(string *)&block_hash);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction ProcessPSBT(const std::string& psbt_string, const std::any& context, const HidingSigningProvider& provider, int sighash_type, bool finalize)
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, psbt_string, error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    if (g_txindex) g_txindex->BlockUntilSyncedToCurrentChain();
    const NodeContext& node = EnsureAnyNodeContext(context);

    // If we can't find the corresponding full transaction for all of our inputs,
    // this will be used to find just the utxos for the segwit inputs for which
    // the full transaction isn't found
    std::map<COutPoint, Coin> coins;

    // Fetch previous transactions:
    // First, look in the txindex and the mempool
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& psbt_input = psbtx.inputs.at(i);
        const CTxIn& tx_in = psbtx.tx->vin.at(i);

        // The `non_witness_utxo` is the whole previous transaction
        if (psbt_input.non_witness_utxo) continue;

        CTransactionRef tx;

        // Look in the txindex
        if (g_txindex) {
            uint256 block_hash;
            g_txindex->FindTx(tx_in.prevout.hash, block_hash, tx);
        }
        // If we still don't have it look in the mempool
        if (!tx) {
            tx = node.mempool->get(tx_in.prevout.hash);
        }
        if (tx) {
            psbt_input.non_witness_utxo = tx;
        } else {
            coins[tx_in.prevout]; // Create empty map entry keyed by prevout
        }
    }

    // If we still haven't found all of the inputs, look for the missing ones in the utxo set
    if (!coins.empty()) {
        FindCoins(node, coins);
        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs.at(i);

            // If there are still missing utxos, add them if they were found in the utxo set
            if (!input.non_witness_utxo) {
                const CTxIn& tx_in = psbtx.tx->vin.at(i);
                const Coin& coin = coins.at(tx_in.prevout);
                if (!coin.out.IsNull() && IsSegWitOutput(provider, coin.out.scriptPubKey)) {
                    input.witness_utxo = coin.out;
                }
            }
        }
    }

    const PrecomputedTransactionData& txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        if (PSBTInputSigned(psbtx.inputs.at(i))) {
            continue;
        }

        // Update script/keypath information using descriptor data.
        // Note that SignPSBTInput does a lot more than just constructing ECDSA signatures.
        // We only actually care about those if our signing provider doesn't hide private
        // information, as is the case with `descriptorprocesspsbt`
        SignPSBTInput(provider, psbtx, /*index=*/i, &txdata, sighash_type, /*out_sigdata=*/nullptr, finalize);
    }

    // Update script/keypath information using descriptor data.
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(provider, psbtx, i);
    }

    RemoveUnnecessaryTransactions(psbtx, /*sighash_type=*/1);

    return psbtx;
}